

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLog.cpp
# Opt level: O0

void __thiscall SocketLog::post(SocketLog *this,string *msg)

{
  string *msg_local;
  SocketLog *this_local;
  
  if ((this->inited & 1U) != 0) {
    std::mutex::lock(&this->msgQueueMutex);
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(&this->msgQueue,msg);
    std::mutex::unlock(&this->msgQueueMutex);
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void SocketLog::post(const std::string& msg) {
    if (!inited)
        return;

    msgQueueMutex.lock();
    msgQueue.push(msg);
    msgQueueMutex.unlock();
    msgQueueCondition.notify_one();
}